

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

NonMaximumSuppressionLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_nonmaximumsuppression(NeuralNetworkLayer *this)

{
  NonMaximumSuppressionLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x578) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x578;
    this_00 = (NonMaximumSuppressionLayerParams *)operator_new(0x28);
    NonMaximumSuppressionLayerParams::NonMaximumSuppressionLayerParams(this_00);
    (this->layer_).nonmaximumsuppression_ = this_00;
  }
  return (NonMaximumSuppressionLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::NonMaximumSuppressionLayerParams* NeuralNetworkLayer::mutable_nonmaximumsuppression() {
  if (!has_nonmaximumsuppression()) {
    clear_layer();
    set_has_nonmaximumsuppression();
    layer_.nonmaximumsuppression_ = new ::CoreML::Specification::NonMaximumSuppressionLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.NonMaximumSuppression)
  return layer_.nonmaximumsuppression_;
}